

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

void trie_inplace_bucket_insert
               (tommy_uint_t shift,tommy_trie_inplace_node **let_ptr,tommy_trie_inplace_node *insert
               ,tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node *ptVar2;
  long in_FS_OFFSET;
  bool bVar3;
  tommy_trie_inplace_node *local_38;
  tommy_trie_inplace_node *node;
  tommy_key_t key_local;
  tommy_trie_inplace_node *insert_local;
  tommy_trie_inplace_node **let_ptr_local;
  tommy_uint_t shift_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = *let_ptr;
  insert_local = (tommy_trie_inplace_node *)let_ptr;
  let_ptr_local._4_4_ = shift;
  while( true ) {
    bVar3 = false;
    if (local_38 != (tommy_trie_inplace_node *)0x0) {
      bVar3 = local_38->key != key;
    }
    if (!bVar3) break;
    insert_local = (tommy_trie_inplace_node *)
                   (local_38->map + (key >> ((byte)let_ptr_local._4_4_ & 0x1f) & 3));
    local_38 = insert_local->next;
    let_ptr_local._4_4_ = let_ptr_local._4_4_ - 2;
  }
  if (local_38 == (tommy_trie_inplace_node *)0x0) {
    ptVar2 = tommy_trie_inplace_list_insert_first(insert);
    insert_local->next = ptVar2;
  }
  else {
    tommy_trie_inplace_list_insert_tail_not_empty(local_38,insert);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void trie_inplace_bucket_insert(tommy_uint_t shift, tommy_trie_inplace_node** let_ptr, tommy_trie_inplace_node* insert, tommy_key_t key)
{
	tommy_trie_inplace_node* node;

	node = *let_ptr;
	while (node && node->key != key) {
		let_ptr = &node->map[(key >> shift) & TOMMY_TRIE_INPLACE_TREE_MASK];
		node = *let_ptr;
		shift -= TOMMY_TRIE_INPLACE_TREE_BIT;
	}

	/* if null, just insert the node */
	if (!node) {
		/* setup the node as a list */
		*let_ptr = tommy_trie_inplace_list_insert_first(insert);
	} else {
		/* if it's the same key, insert in the list */
		tommy_trie_inplace_list_insert_tail_not_empty(node, insert);
	}
}